

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O3

void plutovg_canvas_glyph_metrics
               (plutovg_canvas_t *canvas,plutovg_codepoint_t codepoint,float *advance_width,
               float *left_side_bearing,plutovg_rect_t *extents)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  plutovg_font_face_t *face;
  glyph_t *pgVar6;
  float fVar7;
  
  face = canvas->state->font_face;
  if ((face != (plutovg_font_face_t *)0x0) && (fVar7 = canvas->state->font_size, 0.0 < fVar7)) {
    uVar3 = *(ushort *)((face->info).data + (long)(face->info).head + 0x12);
    fVar7 = fVar7 / (float)(ushort)(uVar3 << 8 | uVar3 >> 8);
    pgVar6 = plutovg_font_face_get_glyph(face,codepoint);
    if (advance_width != (float *)0x0) {
      *advance_width = (float)pgVar6->advance_width * fVar7;
    }
    if (left_side_bearing != (float *)0x0) {
      *left_side_bearing = (float)pgVar6->left_side_bearing * fVar7;
    }
    if (extents != (plutovg_rect_t *)0x0) {
      uVar1 = pgVar6->y1;
      uVar2 = pgVar6->x2;
      iVar4 = pgVar6->x1;
      iVar5 = pgVar6->y2;
      extents->x = fVar7 * (float)iVar4;
      extents->y = -fVar7 * (float)iVar5;
      extents->w = fVar7 * (float)(uVar2 - iVar4);
      extents->h = -fVar7 * (float)(uVar1 - iVar5);
    }
    return;
  }
  if (advance_width != (float *)0x0) {
    *advance_width = 0.0;
  }
  if (left_side_bearing != (float *)0x0) {
    *left_side_bearing = 0.0;
  }
  if (extents != (plutovg_rect_t *)0x0) {
    extents->x = 0.0;
    extents->y = 0.0;
    extents->w = 0.0;
    extents->h = 0.0;
  }
  return;
}

Assistant:

void plutovg_canvas_glyph_metrics(plutovg_canvas_t* canvas, plutovg_codepoint_t codepoint, float* advance_width, float* left_side_bearing, plutovg_rect_t* extents)
{
    plutovg_state_t* state = canvas->state;
    if(state->font_face && state->font_size > 0.f) {
        plutovg_font_face_get_glyph_metrics(state->font_face, state->font_size, codepoint, advance_width, left_side_bearing, extents);
        return;
    }

    if(advance_width) *advance_width = 0.f;
    if(left_side_bearing) *left_side_bearing = 0.f;
    if(extents) {
        extents->x = 0.f;
        extents->y = 0.f;
        extents->w = 0.f;
        extents->h = 0.f;
    }
}